

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O3

void __thiscall SqlGenerator::generateJoinQuery(SqlGenerator *this)

{
  pointer pcVar1;
  size_t sVar2;
  TDNode *pTVar3;
  Attribute *pAVar4;
  long *plVar5;
  long *plVar6;
  char *__end;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string attributeString;
  string joinString;
  ofstream ofs;
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 *local_230;
  filebuf local_228 [8];
  undefined1 local_220 [232];
  ios_base local_138 [264];
  
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"","");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"","");
  uVar7 = 0;
  while( true ) {
    sVar2 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar2 <= uVar7) break;
    pTVar3 = TreeDecomposition::getRelation
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar7);
    std::__cxx11::string::_M_append((char *)local_2b0,(ulong)(pTVar3->_name)._M_dataplus._M_p);
    sVar2 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    uVar7 = uVar7 + 1;
    if (uVar7 < sVar2) {
      std::__cxx11::string::append((char *)local_2b0);
    }
  }
  uVar7 = 0;
  while( true ) {
    sVar2 = TreeDecomposition::numberOfAttributes
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar2 <= uVar7) break;
    pAVar4 = TreeDecomposition::getAttribute
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar7);
    pcVar1 = (pAVar4->_name)._M_dataplus._M_p;
    local_230 = local_220;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar1,pcVar1 + (pAVar4->_name)._M_string_length);
    std::__cxx11::string::append((char *)&local_230);
    std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_230);
    if (local_230 != local_220) {
      operator_delete(local_230);
    }
    uVar7 = uVar7 + 1;
  }
  std::__cxx11::string::pop_back();
  local_2f0 = &local_2e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_2f0);
  std::ofstream::ofstream(&local_230,(string *)&local_2f0,_S_out);
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  std::operator+(&local_250,"CREATE TABLE joinres AS (SELECT ",&local_2d0);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_280 = *plVar6;
    lStack_278 = plVar5[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *plVar6;
    local_290 = (long *)*plVar5;
  }
  local_288 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0[0]);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_260 = *plVar6;
    lStack_258 = plVar5[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *plVar6;
    local_270 = (long *)*plVar5;
  }
  local_268 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_270);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_2e0 = *plVar6;
    lStack_2d8 = plVar5[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *plVar6;
    local_2f0 = (long *)*plVar5;
  }
  local_2e8 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,(char *)local_2f0,local_2e8);
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  std::ofstream::close();
  local_2f0 = &local_2e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_2f0);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_2f0);
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"\\COPY joinres TO \'joinresult.txt\' CSV DELIMITER \'|\';\n",
             0x35);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _error_with_option_name;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if (local_2b0[0] != local_2a0) {
    operator_delete(local_2b0[0]);
  }
  return;
}

Assistant:

void SqlGenerator::generateJoinQuery()
{
    string joinString = "", attributeString  = "";
    
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {    
        joinString += _td->getRelation(rel)->_name;
        if (rel + 1 < _td->numberOfRelations())
            joinString += " NATURAL JOIN ";
    }

    // TODO: This should only output the features not all variables.
    // If changed it should be changed in the Application load test data as well.
    for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
        attributeString += _td->getAttribute(var)->_name + ",";
    attributeString.pop_back();

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/join.sql", std::ofstream::out);
    ofs << "CREATE TABLE joinres AS (SELECT "+attributeString+
        "\nFROM "+joinString+");\n";
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/export.sql", std::ofstream::out);
    ofs << "\\COPY joinres TO \'joinresult.txt\' CSV DELIMITER '|';\n";
    ofs.close();
}